

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool config_find_double(ConfigScanner *sc,char *section,char *name,double *result)

{
  ConfigItem *pCVar1;
  ItemValue *in_RCX;
  char *in_RDX;
  ConfigScanner *in_RSI;
  ConfigItem *temp;
  _Bool local_1;
  
  pCVar1 = config_find(in_RSI,in_RDX,(char *)&in_RCX->v_integer);
  if (pCVar1 == (ConfigItem *)0x0) {
    local_1 = false;
  }
  else if (pCVar1->vtype == VTYPE_DOUBLE) {
    *in_RCX = pCVar1->value;
    local_1 = true;
  }
  else if (pCVar1->vtype == VTYPE_INTEGER) {
    in_RCX->v_double = (double)(pCVar1->value).v_integer;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool config_find_double(ConfigScanner *sc, const char *section, char *name, double *result)
{
	ConfigItem *temp = config_find(sc, section, name);
	if (temp == NULL)
	{
		return false;
	}
	if (temp->vtype == VTYPE_DOUBLE)
	{
		*result = temp->value.v_double;
		return true;
	}
	else if (temp->vtype == VTYPE_INTEGER)
	{
		*result = (double)temp->value.v_integer;
		return true;
	}
	return false;
}